

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_load(lua_State *L,lua_Reader reader,void *data,char *chunkname,char *mode)

{
  int iVar1;
  int iVar2;
  undefined1 local_58 [4];
  int status;
  ZIO z;
  char *mode_local;
  char *chunkname_local;
  void *data_local;
  lua_Reader reader_local;
  lua_State *L_local;
  
  iVar1 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar1 + 1;
  z.L = (lua_State *)mode;
  if (iVar1 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x545,"int lua_load(lua_State *, lua_Reader, void *, const char *, const char *)"
                 );
  }
  mode_local = chunkname;
  if (chunkname == (char *)0x0) {
    mode_local = "?";
  }
  luaZ_init(L,(ZIO *)local_58,reader,data);
  iVar1 = luaD_protectedparser(L,(ZIO *)local_58,mode_local,(char *)z.L);
  if (iVar1 == 0) {
    ravi_closure_setenv(L);
  }
  iVar2 = **(int **)&L[-1].hookmask + -1;
  **(int **)&L[-1].hookmask = iVar2;
  if (iVar2 == 0) {
    return iVar1;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x54c,"int lua_load(lua_State *, lua_Reader, void *, const char *, const char *)");
}

Assistant:

LUA_API int lua_load (lua_State *L, lua_Reader reader, void *data,
                      const char *chunkname, const char *mode) {
  ZIO z;
  int status;
  lua_lock(L);
  if (!chunkname) chunkname = "?";
  luaZ_init(L, &z, reader, data);
  status = luaD_protectedparser(L, &z, chunkname, mode);
  if (status == LUA_OK) {  /* no errors? */
    ravi_closure_setenv(L);
  }
  lua_unlock(L);
  return status;
}